

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-impl.cpp
# Opt level: O2

string * llama_format_tensor_shape_abi_cxx11_(string *__return_storage_ptr__,ggml_tensor *t)

{
  size_t sVar1;
  long lVar2;
  char buf [256];
  allocator<char> local_129;
  char local_128 [256];
  
  snprintf(local_128,0x100,"%5ld",t->ne[0]);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    sVar1 = strlen(local_128);
    snprintf(local_128 + sVar1,0x100 - sVar1,", %5ld",t->ne[lVar2 + 1]);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_128,&local_129);
  return __return_storage_ptr__;
}

Assistant:

std::string llama_format_tensor_shape(const struct ggml_tensor * t) {
    char buf[256];
    snprintf(buf, sizeof(buf), "%5" PRId64, t->ne[0]);
    for (int i = 1; i < GGML_MAX_DIMS; i++) {
        snprintf(buf + strlen(buf), sizeof(buf) - strlen(buf), ", %5" PRId64, t->ne[i]);
    }
    return buf;
}